

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O0

RDL_BCCGraph * RDL_tarjanBCC(RDL_graph *graph)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  RDL_BCCGraph *pRVar6;
  void *__ptr;
  void *__ptr_00;
  RDL_graph **ppRVar7;
  uint **ppuVar8;
  uint *puVar9;
  RDL_graph *pRVar10;
  RDL_BCCGraph *result;
  uint *non_trivial_mapping;
  uint found;
  uint curr_bcc;
  uint nof_nontrivial_bcc;
  uint *bcc_size;
  uint nof_bcc;
  uint ii [2];
  uint k;
  uint j;
  uint i;
  uint node;
  uint u;
  uint *bcc;
  RDL_graph *graph_local;
  
  found = 0;
  bcc = &graph->V;
  bcc_size._0_4_ = RDL_tarjan(graph,(uint **)&node);
  pRVar6 = (RDL_BCCGraph *)malloc(0x50);
  __ptr = malloc((ulong)(uint)bcc_size << 2);
  __ptr_00 = malloc((ulong)(uint)bcc_size << 2);
  for (k = 0; k < (uint)bcc_size; k = k + 1) {
    *(undefined4 *)((long)__ptr + (ulong)k * 4) = 0;
  }
  for (k = 0; k < bcc[1]; k = k + 1) {
    if (_node[k] == 0) {
      (*RDL_outputFunc)(RDL_ERROR,"edge has no associated BCC %u\n",(ulong)k);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                    ,0xdd,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
    }
    *(int *)((long)__ptr + (ulong)(_node[k] - 1) * 4) =
         *(int *)((long)__ptr + (ulong)(_node[k] - 1) * 4) + 1;
  }
  for (k = 0; k < (uint)bcc_size; k = k + 1) {
    if (*(uint *)((long)__ptr + (ulong)k * 4) < 2) {
      *(uint *)((long)__ptr_00 + (ulong)k * 4) = 0xfffffffd;
    }
    else {
      *(uint *)((long)__ptr_00 + (ulong)k * 4) = found;
      found = found + 1;
    }
  }
  pRVar6->complete_graph = (RDL_graph *)bcc;
  ppRVar7 = (RDL_graph **)malloc((ulong)found << 3);
  pRVar6->bcc_graphs = ppRVar7;
  ppuVar8 = (uint **)malloc((ulong)bcc[1] << 3);
  pRVar6->edge_to_bcc_mapping = ppuVar8;
  for (k = 0; k < bcc[1]; k = k + 1) {
    puVar9 = (uint *)malloc(8);
    pRVar6->edge_to_bcc_mapping[k] = puVar9;
    *pRVar6->edge_to_bcc_mapping[k] = 0xfffffffd;
    pRVar6->edge_to_bcc_mapping[k][1] = 0xfffffffd;
  }
  ppuVar8 = (uint **)malloc((ulong)found << 3);
  pRVar6->edge_from_bcc_mapping = ppuVar8;
  puVar9 = (uint *)malloc((ulong)found << 2);
  pRVar6->nof_edges_per_bcc = puVar9;
  for (k = 0; k < found; k = k + 1) {
    pRVar6->edge_from_bcc_mapping[k] = (uint *)0x0;
    pRVar6->nof_edges_per_bcc[k] = 0;
  }
  ppuVar8 = (uint **)malloc((ulong)*bcc << 3);
  pRVar6->node_to_bcc_mapping = ppuVar8;
  puVar9 = (uint *)malloc((ulong)*bcc << 2);
  pRVar6->nof_bcc_per_node = puVar9;
  for (k = 0; k < *bcc; k = k + 1) {
    pRVar6->nof_bcc_per_node[k] = 0;
    pRVar6->node_to_bcc_mapping[k] = (uint *)0x0;
  }
  ppuVar8 = (uint **)malloc((ulong)found << 3);
  pRVar6->node_from_bcc_mapping = ppuVar8;
  puVar9 = (uint *)malloc((ulong)found << 2);
  pRVar6->nof_nodes_per_bcc = puVar9;
  for (k = 0; k < found; k = k + 1) {
    pRVar6->node_from_bcc_mapping[k] = (uint *)0x0;
    pRVar6->nof_nodes_per_bcc[k] = 0;
  }
  pRVar6->nof_bcc = found;
  for (k = 0; k < bcc[1]; k = k + 1) {
    if (1 < *(uint *)((long)__ptr + (ulong)(_node[k] - 1) * 4)) {
      uVar1 = *(uint *)((long)__ptr_00 + (ulong)(_node[k] - 1) * 4);
      *pRVar6->edge_to_bcc_mapping[k] = uVar1;
      uVar2 = pRVar6->nof_edges_per_bcc[uVar1];
      pRVar6->nof_edges_per_bcc[uVar1] = uVar2 + 1;
      pRVar6->edge_to_bcc_mapping[k][1] = uVar2;
      puVar9 = (uint *)realloc(pRVar6->edge_from_bcc_mapping[uVar1],
                               (ulong)pRVar6->nof_edges_per_bcc[uVar1] << 2);
      pRVar6->edge_from_bcc_mapping[uVar1] = puVar9;
      pRVar6->edge_from_bcc_mapping[uVar1][pRVar6->nof_edges_per_bcc[uVar1] - 1] = k;
      for (ii[0] = 0; ii[0] < 2; ii[0] = ii[0] + 1) {
        uVar2 = *(uint *)(*(long *)(*(long *)(bcc + 6) + (ulong)k * 8) + (ulong)ii[0] * 4);
        bVar5 = false;
        ii[1] = 0;
        while( true ) {
          bVar4 = false;
          if (ii[1] < pRVar6->nof_bcc_per_node[uVar2]) {
            bVar4 = (bool)(bVar5 ^ 1);
          }
          if (!bVar4) break;
          if (pRVar6->node_to_bcc_mapping[uVar2][ii[1] << 1] == uVar1) {
            bVar5 = true;
          }
          ii[1] = ii[1] + 1;
        }
        if (!bVar5) {
          pRVar6->nof_bcc_per_node[uVar2] = pRVar6->nof_bcc_per_node[uVar2] + 1;
          puVar9 = (uint *)realloc(pRVar6->node_to_bcc_mapping[uVar2],
                                   (ulong)(pRVar6->nof_bcc_per_node[uVar2] << 1) << 3);
          pRVar6->node_to_bcc_mapping[uVar2] = puVar9;
          pRVar6->node_to_bcc_mapping[uVar2][(pRVar6->nof_bcc_per_node[uVar2] - 1) * 2] = uVar1;
          uVar3 = pRVar6->nof_nodes_per_bcc[uVar1];
          pRVar6->nof_nodes_per_bcc[uVar1] = uVar3 + 1;
          pRVar6->node_to_bcc_mapping[uVar2][(pRVar6->nof_bcc_per_node[uVar2] - 1) * 2 + 1] = uVar3;
          puVar9 = (uint *)realloc(pRVar6->node_from_bcc_mapping[uVar1],
                                   (ulong)pRVar6->nof_nodes_per_bcc[uVar1] << 2);
          pRVar6->node_from_bcc_mapping[uVar1] = puVar9;
          pRVar6->node_from_bcc_mapping[uVar1][pRVar6->nof_nodes_per_bcc[uVar1] - 1] = uVar2;
        }
      }
    }
  }
  for (i = 0; i < found; i = i + 1) {
    pRVar10 = RDL_initNewGraph(pRVar6->nof_nodes_per_bcc[i]);
    pRVar6->bcc_graphs[i] = pRVar10;
  }
  k = 0;
  do {
    if (bcc[1] <= k) {
      free(_node);
      free(__ptr);
      free(__ptr_00);
      return pRVar6;
    }
    uVar1 = *pRVar6->edge_to_bcc_mapping[k];
    if (uVar1 != 0xfffffffd) {
      nof_bcc = 0xfffffffd;
      bcc_size._4_4_ = 0xfffffffd;
      for (ii[0] = 0; ii[0] < 2; ii[0] = ii[0] + 1) {
        for (ii[1] = 0;
            ii[1] < pRVar6->nof_bcc_per_node
                    [*(uint *)(*(long *)(*(long *)(bcc + 6) + (ulong)k * 8) + (ulong)ii[0] * 4)];
            ii[1] = ii[1] + 1) {
          if (pRVar6->node_to_bcc_mapping
              [*(uint *)(*(long *)(*(long *)(bcc + 6) + (ulong)k * 8) + (ulong)ii[0] * 4)]
              [ii[1] << 1] == uVar1) {
            *(uint *)((long)&bcc_size + (ulong)ii[0] * 4 + 4) =
                 pRVar6->node_to_bcc_mapping
                 [*(uint *)(*(long *)(*(long *)(bcc + 6) + (ulong)k * 8) + (ulong)ii[0] * 4)]
                 [ii[1] * 2 + 1];
          }
        }
        if (*(uint *)((long)&bcc_size + (ulong)ii[0] * 4 + 4) == 0xfffffffd) {
          (*RDL_outputFunc)(RDL_ERROR,"node %u not part of BCC %u!\n",
                            (ulong)*(uint *)(*(long *)(*(long *)(bcc + 6) + (ulong)k * 8) +
                                            (ulong)ii[0] * 4),(ulong)uVar1);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                        ,0x14f,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
        }
      }
      RDL_addUEdge(pRVar6->bcc_graphs[uVar1],bcc_size._4_4_,nof_bcc);
    }
    k = k + 1;
  } while( true );
}

Assistant:

RDL_BCCGraph* RDL_tarjanBCC(const RDL_graph* graph)
{
  unsigned *bcc, u, node, i, j, k, ii[2],
    nof_bcc, *bcc_size, nof_nontrivial_bcc=0, curr_bcc, found;
  unsigned *non_trivial_mapping;
  RDL_BCCGraph* result;

  nof_bcc = RDL_tarjan(graph, &bcc);

  result = malloc(sizeof(*result));
  bcc_size = malloc(nof_bcc * sizeof(*bcc_size));
  non_trivial_mapping = malloc(nof_bcc * sizeof(*non_trivial_mapping));

  for (i = 0; i < nof_bcc; ++i) {
    bcc_size[i] = 0;
  }

  for (i = 0; i < graph->E; ++i) {
    if (bcc[i] == 0) {
      RDL_outputFunc(RDL_ERROR, "edge has no associated BCC %u\n", i);
      assert(0); /* should NEVER happen */
    }
    curr_bcc = bcc[i];
    ++bcc_size[curr_bcc - 1];
  }

  for (i = 0; i < nof_bcc; ++i) {
    if(bcc_size[i] > 1) {
      non_trivial_mapping[i] = nof_nontrivial_bcc;
      ++nof_nontrivial_bcc;
    }
    else {
      non_trivial_mapping[i] = RDL_NO_RINGSYSTEM;
    }
  }

  result->complete_graph = graph;

  result->bcc_graphs = malloc(nof_nontrivial_bcc * sizeof(*result->bcc_graphs));
  result->edge_to_bcc_mapping = malloc(graph->E * sizeof(*result->edge_to_bcc_mapping));

  for (i = 0; i < graph->E; ++i) {
    result->edge_to_bcc_mapping[i] = malloc(2 * sizeof(**result->edge_to_bcc_mapping));
    result->edge_to_bcc_mapping[i][0] = RDL_NO_RINGSYSTEM;
    result->edge_to_bcc_mapping[i][1] = RDL_NO_RINGSYSTEM;
  }

  result->edge_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->edge_from_bcc_mapping));
  result->nof_edges_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_edges_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->edge_from_bcc_mapping[i] = NULL;
    result->nof_edges_per_bcc[i] = 0;
  }

  result->node_to_bcc_mapping = malloc(graph->V * sizeof(*result->node_to_bcc_mapping));
  result->nof_bcc_per_node = malloc(graph->V * sizeof(*result->nof_bcc_per_node));
  for (i = 0; i < graph->V; ++i) {
    result->nof_bcc_per_node[i] = 0;
    result->node_to_bcc_mapping[i] = NULL;
  }

  result->node_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->node_from_bcc_mapping));
  result->nof_nodes_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_nodes_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->node_from_bcc_mapping[i] = NULL;
    result->nof_nodes_per_bcc[i] = 0;
  }

  result->nof_bcc = nof_nontrivial_bcc;

  for (i = 0; i < graph->E; ++i) {
    curr_bcc = bcc[i];

    /* skip trivial BCCs */
    if (bcc_size[curr_bcc-1] <= 1) {
      continue;
    }

    /* -1 because of 1-based BCCs */
    u = non_trivial_mapping[curr_bcc - 1];
    result->edge_to_bcc_mapping[i][0] = u;
    result->edge_to_bcc_mapping[i][1] = result->nof_edges_per_bcc[u]++;
    result->edge_from_bcc_mapping[u] = realloc(result->edge_from_bcc_mapping[u],
        result->nof_edges_per_bcc[u] * sizeof(**result->edge_from_bcc_mapping));
    result->edge_from_bcc_mapping[u][result->nof_edges_per_bcc[u] - 1] = i;

    for (k = 0; k <= 1; ++k) {
      node = graph->edges[i][k];

      found = 0;
      for (j = 0; j < result->nof_bcc_per_node[node] && !found; ++j) {
        if (result->node_to_bcc_mapping[node][2 * j] == u) {
          found = 1;
        }
      }

      if (!found) {
        ++result->nof_bcc_per_node[node];
        result->node_to_bcc_mapping[node] = realloc(result->node_to_bcc_mapping[node],
            2*result->nof_bcc_per_node[node]*sizeof(result->node_to_bcc_mapping[node]));
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)] = u;
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)+1] = result->nof_nodes_per_bcc[u]++;

        result->node_from_bcc_mapping[u] = realloc(result->node_from_bcc_mapping[u],
            result->nof_nodes_per_bcc[u] * sizeof(**result->node_from_bcc_mapping));
        result->node_from_bcc_mapping[u][result->nof_nodes_per_bcc[u]-1] = node;
      }
    }
  }

  for (u = 0; u < nof_nontrivial_bcc; ++u) {
    result->bcc_graphs[u] = RDL_initNewGraph(result->nof_nodes_per_bcc[u]);
  }

  for (i = 0; i < graph->E; ++i) {
    u = result->edge_to_bcc_mapping[i][0];

    /* skip if there is no BCC */
    if (u == RDL_NO_RINGSYSTEM) {
      continue;
    }

    ii[0] = ii[1] = RDL_NO_RINGSYSTEM;

    for (k = 0; k <= 1; ++ k) {
      for (j = 0; j < result->nof_bcc_per_node[graph->edges[i][k]]; ++j) {
        if (result->node_to_bcc_mapping[graph->edges[i][k]][2 * j] == u) {
          ii[k] = result->node_to_bcc_mapping[graph->edges[i][k]][2 * j + 1];
        }
      }
      if (ii[k] == RDL_NO_RINGSYSTEM) {
        RDL_outputFunc(RDL_ERROR, "node %u not part of BCC %u!\n",
            graph->edges[i][k], u);
        /* should never happen */
        assert(0);
      }
    }
    RDL_addUEdge(result->bcc_graphs[u], ii[0], ii[1]);
  }

  free(bcc);
  free(bcc_size);
  free(non_trivial_mapping);

  return result;
}